

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O1

set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
* __thiscall
Kandinsky::BaseExpression::variables
          (set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
           *__return_storage_ptr__,BaseExpression *this,
          shared_ptr<Kandinsky::BaseExpression> *thisSharedPtr)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*this->_vptr_BaseExpression[4])(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::set<Variable, VariableLessThanComparator> BaseExpression::variables(const std::shared_ptr<BaseExpression>& thisSharedPtr) const
    {
        std::set<Variable, VariableLessThanComparator> variableSet;
        fillVariableSet(variableSet, thisSharedPtr);
        return variableSet;
    }